

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent_simd.cpp
# Opt level: O0

unique_ptr<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
ear::get_polar_extent_core(void)

{
  dispatcher<ear::GetPolarExtentCore,_xsimd::arch_list<xsimd::avx512bw,_xsimd::fma3<xsimd::avx2>,_xsimd::avx,_xsimd::sse4_2,_xsimd::sse2,_xsimd::generic_for_dispatch>_>
  dVar1;
  __uniq_ptr_data<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>,_true,_true>
  in_RDI;
  GetPolarExtentCore local_19;
  uint local_18;
  dispatcher<ear::GetPolarExtentCore,_xsimd::arch_list<xsimd::avx512bw,_xsimd::fma3<xsimd::avx2>,_xsimd::avx,_xsimd::sse4_2,_xsimd::sse2,_xsimd::generic_for_dispatch>_>
  dispatcher;
  
  dVar1 = xsimd::
          dispatch<xsimd::arch_list<xsimd::avx512bw,xsimd::fma3<xsimd::avx2>,xsimd::avx,xsimd::sse4_2,xsimd::sse2,xsimd::generic_for_dispatch>,ear::GetPolarExtentCore>
                    (&local_19);
  local_18 = dVar1.best_arch_found;
  xsimd::detail::
  dispatcher<ear::GetPolarExtentCore,_xsimd::arch_list<xsimd::avx512bw,_xsimd::fma3<xsimd::avx2>,_xsimd::avx,_xsimd::sse4_2,_xsimd::sse2,_xsimd::generic_for_dispatch>_>
  ::operator()<>((dispatcher<ear::GetPolarExtentCore,_xsimd::arch_list<xsimd::avx512bw,_xsimd::fma3<xsimd::avx2>,_xsimd::avx,_xsimd::sse4_2,_xsimd::sse2,_xsimd::generic_for_dispatch>_>
                  *)in_RDI.
                    super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
                    .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl);
  return (__uniq_ptr_data<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>,_true,_true>
          )(tuple<ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>)
           in_RDI.
           super___uniq_ptr_impl<ear::PolarExtentCore,_std::default_delete<ear::PolarExtentCore>_>.
           _M_t.
           super__Tuple_impl<0UL,_ear::PolarExtentCore_*,_std::default_delete<ear::PolarExtentCore>_>
           .super__Head_base<0UL,_ear::PolarExtentCore_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<PolarExtentCore> get_polar_extent_core() {
    auto dispatcher = xsimd::dispatch<arch_list>(GetPolarExtentCore{});
    return dispatcher();
  }